

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraTransferPermuteRecur
                   (DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table,int *Permute)

{
  DdNode *T;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  DdHalfWord local_7c;
  int comple;
  int index;
  DdNode *zero;
  DdNode *one;
  DdNode *res;
  DdNode *var;
  DdNode *e;
  DdNode *t;
  DdNode *fe;
  DdNode *ft;
  int *Permute_local;
  st__table *table_local;
  DdNode *f_local;
  DdManager *ddD_local;
  DdManager *ddS_local;
  
  T = ddD->one;
  uVar2 = (uint)f & 1;
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    ddS_local = (DdManager *)((ulong)T ^ (long)(int)uVar2);
  }
  else {
    table_local = (st__table *)((ulong)f ^ (long)(int)uVar2);
    ft = (DdNode *)Permute;
    Permute_local = (int *)table;
    f_local = &ddD->sentinel;
    ddD_local = ddS;
    iVar3 = st__lookup(table,(char *)table_local,(char **)&one);
    if (iVar3 == 0) {
      if ((ddD_local->TimeStop != 0) && (aVar4 = Abc_Clock(), ddD_local->TimeStop < aVar4)) {
        return (DdNode *)0x0;
      }
      if ((f_local[0x12].Id != 0) && (aVar4 = Abc_Clock(), f_local[0x12].Id < aVar4)) {
        return (DdNode *)0x0;
      }
      if (ft == (DdNode *)0x0) {
        local_7c = *(DdHalfWord *)&table_local->compare;
      }
      else {
        local_7c = (&ft->index)[*(uint *)&table_local->compare];
      }
      fe = *(DdNode **)&table_local->num_bins;
      t = *(DdNode **)&table_local->max_density;
      e = extraTransferPermuteRecur
                    (ddD_local,(DdManager *)f_local,fe,(st__table *)Permute_local,(int *)ft);
      if (e == (DdNode *)0x0) {
        ddS_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
        var = extraTransferPermuteRecur
                        (ddD_local,(DdManager *)f_local,t,(st__table *)Permute_local,(int *)ft);
        if (var == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)f_local,e);
          ddS_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)var & 0xfffffffffffffffe) + 4) + 1;
          uVar1._0_4_ = f_local[1].index;
          uVar1._4_4_ = f_local[1].ref;
          res = cuddUniqueInter((DdManager *)f_local,local_7c,T,(DdNode *)(uVar1 ^ 1));
          if (res == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)f_local,e);
            Cudd_RecursiveDeref((DdManager *)f_local,var);
            ddS_local = (DdManager *)0x0;
          }
          else {
            one = cuddBddIteRecur((DdManager *)f_local,res,e,var);
            if (one == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)f_local,e);
              Cudd_RecursiveDeref((DdManager *)f_local,var);
              ddS_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref((DdManager *)f_local,e);
              Cudd_RecursiveDeref((DdManager *)f_local,var);
              iVar3 = st__add_direct((st__table *)Permute_local,(char *)table_local,(char *)one);
              if (iVar3 == -10000) {
                Cudd_RecursiveDeref((DdManager *)f_local,one);
                ddS_local = (DdManager *)0x0;
              }
              else {
                ddS_local = (DdManager *)((ulong)one ^ (long)(int)uVar2);
              }
            }
          }
        }
      }
    }
    else {
      ddS_local = (DdManager *)((ulong)one ^ (long)(int)uVar2);
    }
  }
  return &ddS_local->sentinel;
}

Assistant:

static DdNode * 
extraTransferPermuteRecur( 
  DdManager * ddS, 
  DdManager * ddD, 
  DdNode * f, 
  st__table * table, 
  int * Permute )
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int index;
    int comple = 0;

    statLine( ddD );
    one = DD_ONE( ddD );
    comple = Cudd_IsComplement( f );

    /* Trivial cases. */
    if ( Cudd_IsConstant( f ) )
        return ( Cudd_NotCond( one, comple ) );


    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond( f, comple );
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup( table, ( char * ) f, ( char ** ) &res ) )
        return ( Cudd_NotCond( res, comple ) );

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;

    /* Recursive step. */
    if ( Permute )
        index = Permute[f->index];
    else
        index = f->index;

    ft = cuddT( f );
    fe = cuddE( f );

    t = extraTransferPermuteRecur( ddS, ddD, ft, table, Permute );
    if ( t == NULL )
    {
        return ( NULL );
    }
    cuddRef( t );

    e = extraTransferPermuteRecur( ddS, ddD, fe, table, Permute );
    if ( e == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        return ( NULL );
    }
    cuddRef( e );

    zero = Cudd_Not(ddD->one);
    var = cuddUniqueInter( ddD, index, one, zero );
    if ( var == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    res = cuddBddIteRecur( ddD, var, t, e );

    if ( res == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_RecursiveDeref( ddD, t );
    Cudd_RecursiveDeref( ddD, e );

    if ( st__add_direct( table, ( char * ) f, ( char * ) res ) ==
         st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( ddD, res );
        return ( NULL );
    }
    return ( Cudd_NotCond( res, comple ) );

}